

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-getaddrinfo.c
# Opt level: O3

void getaddrinfo_cb(uv_getaddrinfo_t *handle,int status,addrinfo *res)

{
  int iVar1;
  
  if (status == 0) {
    calls_completed = calls_completed + 1;
    if (calls_initiated < 10000) {
      getaddrinfo_initiate(handle);
    }
    uv_freeaddrinfo(res);
    return;
  }
  getaddrinfo_cb_cold_1();
  iVar1 = uv_is_closing((uv_handle_t *)handle);
  if (iVar1 != 0) {
    return;
  }
  uv_close((uv_handle_t *)handle,(uv_close_cb)0x0);
  return;
}

Assistant:

static void getaddrinfo_cb(uv_getaddrinfo_t* handle, int status,
    struct addrinfo* res) {
  ASSERT(status == 0);
  calls_completed++;
  if (calls_initiated < TOTAL_CALLS) {
    getaddrinfo_initiate(handle);
  }

  uv_freeaddrinfo(res);
}